

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

DisconnectResult __thiscall
Chainstate::DisconnectBlock
          (Chainstate *this,CBlock *block,CBlockIndex *pindex,CCoinsViewCache *view)

{
  uchar *puVar1;
  pointer pCVar2;
  long lVar3;
  uint256 *puVar4;
  CTransaction *this_00;
  uchar *puVar5;
  uchar *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  ulong uVar16;
  char *pcVar17;
  pointer pCVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  DisconnectResult DVar23;
  byte bVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  long in_FS_OFFSET;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  CBlockUndo blockUndo;
  Coin coin;
  COutPoint out;
  Txid hash;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar12 = ::node::BlockManager::UndoReadFromDisk(this->m_blockman,&blockUndo,pindex);
  if (bVar12) {
    uVar16 = (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    if (((long)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 1U == uVar16) {
      if (pindex->nHeight == 0x166a4) {
        puVar4 = pindex->phashBlock;
        if (puVar4 == (uint256 *)0x0) goto LAB_003f883e;
        auVar29[0] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0] == '/');
        auVar29[1] = -((puVar4->super_base_blob<256U>).m_data._M_elems[1] == 'o');
        auVar29[2] = -((puVar4->super_base_blob<256U>).m_data._M_elems[2] == '0');
        auVar29[3] = -((puVar4->super_base_blob<256U>).m_data._M_elems[3] == 0xf9);
        auVar29[4] = -((puVar4->super_base_blob<256U>).m_data._M_elems[4] == 0xd6);
        auVar29[5] = -((puVar4->super_base_blob<256U>).m_data._M_elems[5] == 0x83);
        auVar29[6] = -((puVar4->super_base_blob<256U>).m_data._M_elems[6] == 0xde);
        auVar29[7] = -((puVar4->super_base_blob<256U>).m_data._M_elems[7] == 0xb8);
        auVar29[8] = -((puVar4->super_base_blob<256U>).m_data._M_elems[8] == ']');
        auVar29[9] = -((puVar4->super_base_blob<256U>).m_data._M_elems[9] == 0x93);
        auVar29[10] = -((puVar4->super_base_blob<256U>).m_data._M_elems[10] == '\x14');
        auVar29[0xb] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xb] == 0xef);
        auVar29[0xc] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xc] == ']');
        auVar29[0xd] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xd] == 0xcf);
        auVar29[0xe] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xe] == '6');
        auVar29[0xf] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xf] == 0xaf);
        auVar31[0] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x10] == 'f');
        auVar31[1] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x11] == 0xd9);
        auVar31[2] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x12] == 0xe3);
        auVar31[3] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x13] == 0xce);
        auVar31[4] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x14] == '\x1a');
        auVar31[5] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x15] == '+');
        auVar31[6] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x16] == 'y');
        auVar31[7] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x17] == 0xd4);
        auVar31[8] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x18] == 0xae);
        auVar31[9] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x19] == 0xf0);
        auVar31[10] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1a] == '\n');
        auVar31[0xb] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1b] == '\0');
        auVar31[0xc] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1c] == '\0');
        auVar31[0xd] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1d] == '\0');
        auVar31[0xe] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1e] == '\0');
        auVar31[0xf] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1f] == '\0');
        auVar31 = auVar31 & auVar29;
        bVar12 = (ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) == 0xffff;
      }
      else {
        if (pindex->nHeight == 0x1664a) {
          puVar4 = pindex->phashBlock;
          if (puVar4 == (uint256 *)0x0) goto LAB_003f883e;
          coin.out.nValue = *(CAmount *)(puVar4->super_base_blob<256U>).m_data._M_elems;
          puVar5 = (puVar4->super_base_blob<256U>).m_data._M_elems + 8;
          coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
               (char *)*(undefined8 *)puVar5;
          puVar1 = (puVar4->super_base_blob<256U>).m_data._M_elems + 0x10;
          coin.out.scriptPubKey.super_CScriptBase._union._8_8_ = *(undefined8 *)puVar1;
          puVar6 = (puVar4->super_base_blob<256U>).m_data._M_elems + 0x18;
          coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = *(undefined8 *)puVar6;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = 0x8e;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = 0xd0;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = 'M';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = 'W';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = 0xf2;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = 0xf3;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = 0xcd;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = 0xc6;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = 0xa6;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = 0xe5;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = 'U';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = 'i';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = 0xdc;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\x16';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = 'T';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = 0xe1;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = 0xf2;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\x19';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = 0x84;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\x7f';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = 'f';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = 0xe7;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '&';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = 0xdc;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = 0xa2;
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = 'q';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\x02';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
          auVar30[0] = -(*puVar1 == 0xf2);
          auVar30[1] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x11] == '\x19');
          auVar30[2] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x12] == 0x84);
          auVar30[3] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x13] == '\x7f');
          auVar30[4] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x14] == 'f');
          auVar30[5] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x15] == 0xe7);
          auVar30[6] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x16] == '&');
          auVar30[7] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x17] == 0xdc);
          auVar30[8] = -(*puVar6 == 0xa2);
          auVar30[9] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x19] == 'q');
          auVar30[10] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1a] == '\x02');
          auVar30[0xb] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1b] == '\0');
          auVar30[0xc] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1c] == '\0');
          auVar30[0xd] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1d] == '\0');
          auVar30[0xe] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1e] == '\0');
          auVar30[0xf] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1f] == '\0');
          auVar28[0] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0] == 0x8e);
          auVar28[1] = -((puVar4->super_base_blob<256U>).m_data._M_elems[1] == 0xd0);
          auVar28[2] = -((puVar4->super_base_blob<256U>).m_data._M_elems[2] == 'M');
          auVar28[3] = -((puVar4->super_base_blob<256U>).m_data._M_elems[3] == 'W');
          auVar28[4] = -((puVar4->super_base_blob<256U>).m_data._M_elems[4] == 0xf2);
          auVar28[5] = -((puVar4->super_base_blob<256U>).m_data._M_elems[5] == 0xf3);
          auVar28[6] = -((puVar4->super_base_blob<256U>).m_data._M_elems[6] == 0xcd);
          auVar28[7] = -((puVar4->super_base_blob<256U>).m_data._M_elems[7] == 0xc6);
          auVar28[8] = -(*puVar5 == 0xa6);
          auVar28[9] = -((puVar4->super_base_blob<256U>).m_data._M_elems[9] == 0xe5);
          auVar28[10] = -((puVar4->super_base_blob<256U>).m_data._M_elems[10] == 'U');
          auVar28[0xb] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xb] == 'i');
          auVar28[0xc] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xc] == 0xdc);
          auVar28[0xd] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xd] == '\x16');
          auVar28[0xe] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xe] == 'T');
          auVar28[0xf] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xf] == 0xe1);
          auVar30 = auVar30 & auVar28;
          if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff) {
            bVar12 = true;
            goto LAB_003f8541;
          }
        }
        bVar12 = false;
      }
LAB_003f8541:
      uVar16 = uVar16 & 0xffffffff;
      bVar19 = 1;
      bVar24 = 1;
      do {
        uVar25 = (int)uVar16 - 1;
        if ((int)uVar25 < 0) break;
        this_00 = (block->vtx).
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar25].
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar7 = *(undefined8 *)(this_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar8 = *(undefined8 *)((this_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
        ;
        uVar9 = *(undefined8 *)
                 ((this_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar10 = *(undefined8 *)
                  ((this_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        bVar13 = CTransaction::IsCoinBase(this_00);
        pCVar18 = (this_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish != pCVar18) {
          lVar26 = 0;
          uVar22 = 0;
          do {
            uVar21 = *(uint *)((long)&(pCVar18->scriptPubKey).super_CScriptBase._size + lVar26);
            uVar20 = uVar21 - 0x1d;
            if (uVar21 < 0x1d) {
              uVar20 = uVar21;
            }
            if (uVar20 == 0) {
LAB_003f85f2:
              out.n = (uint32_t)uVar22;
              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = uVar7;
              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = uVar8;
              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = uVar9;
              out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = uVar10;
              CTxOut::CTxOut(&coin.out);
              coin._40_4_ = 0;
              bVar14 = CCoinsViewCache::SpendCoin(view,&out,(Coin *)&coin.out);
              if ((((!bVar14) ||
                   (((pCVar18 = (this_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                     *(long *)((long)&pCVar18->nValue + lVar26) != coin.out.nValue ||
                     (bVar14 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                                         ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                          ((long)&(pCVar18->scriptPubKey).super_CScriptBase._union +
                                          lVar26),&coin.out.scriptPubKey.super_CScriptBase), !bVar14
                     )) || (pindex->nHeight != (uint)coin._40_4_ >> 1)))) ||
                  (((coin._40_1_ ^ bVar13) & 1) != 0)) && (bVar24 = bVar19, (bVar12 & bVar13) == 0))
              {
                bVar19 = 0;
                bVar24 = 0;
              }
              if (0x1c < coin.out.scriptPubKey.super_CScriptBase._size) {
                free(coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
                coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
                     (char *)0x0;
              }
            }
            else {
              pcVar17 = (pCVar18->scriptPubKey).super_CScriptBase._union.direct + lVar26;
              if (0x1c < uVar21) {
                pcVar17 = *(char **)pcVar17;
              }
              if ((uVar20 < 0x2711) && (*pcVar17 != 'j')) goto LAB_003f85f2;
            }
            uVar22 = uVar22 + 1;
            pCVar18 = (this_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar26 = lVar26 + 0x28;
          } while (uVar22 < (ulong)(((long)(this_00->vout).
                                           super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                           _M_impl.super__Vector_impl_data._M_finish - (long)pCVar18
                                    >> 3) * -0x3333333333333333));
        }
        if (uVar25 == 0) {
          bVar13 = true;
        }
        else {
          uVar21 = (int)uVar16 - 2;
          lVar26 = (long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          if (((long)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl
                     .super__Vector_impl_data._M_start[uVar21].vprevout.
                     super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data
                     ._M_finish -
               (long)blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl
                     .super__Vector_impl_data._M_start[uVar21].vprevout.
                     super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data
                     ._M_start >> 4) * -0x5555555555555555 + lVar26 * -0x4ec4ec4ec4ec4ec5 == 0) {
            pCVar2 = blockUndo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl
                     .super__Vector_impl_data._M_start + uVar21;
            uVar22 = lVar26 * 0x4ec4ec4ec4ec4ec5 & 0xffffffff;
            lVar26 = uVar22 * 0x30 + -0x30;
            bVar11 = bVar24;
            lVar27 = uVar22 * 0x68;
            do {
              bVar24 = bVar11;
              bVar13 = lVar26 + -0x30 == -0x60;
              if (bVar13) goto LAB_003f87df;
              iVar15 = ApplyTxInUndo((Coin *)((long)&(((pCVar2->vprevout).
                                                                                                              
                                                  super__Vector_base<Coin,_std::allocator<Coin>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->out).
                                                  nValue + lVar26),view,
                                     (COutPoint *)
                                     ((long)&(this_00->vin).
                                             super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                             _M_impl.super__Vector_impl_data._M_start[-1].prevout.
                                             hash + lVar27));
              bVar19 = iVar15 != 1 & bVar24;
              lVar26 = lVar26 + -0x30;
              bVar11 = bVar19;
              lVar27 = lVar27 + -0x68;
            } while (iVar15 != 2);
            bVar13 = false;
            bVar19 = bVar24;
          }
          else {
            logging_function_00._M_str = "DisconnectBlock";
            logging_function_00._M_len = 0xf;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_00._M_len = 0x5e;
            LogPrintFormatInternal<>
                      (logging_function_00,source_file_00,0x908,ALL,Error,
                       (ConstevalFormatString<0U>)0x82175c);
            bVar13 = false;
          }
        }
LAB_003f87df:
        uVar16 = uVar16 - 1;
      } while (bVar13);
      DVar23 = DISCONNECT_FAILED;
      if ((int)uVar25 < 0) {
        puVar4 = pindex->pprev->phashBlock;
        if (puVar4 == (uint256 *)0x0) {
LAB_003f883e:
          __assert_fail("phashBlock != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                        ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
        }
        coin.out.nValue = *(CAmount *)(puVar4->super_base_blob<256U>).m_data._M_elems;
        coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
             (char *)*(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
        coin.out.scriptPubKey.super_CScriptBase._union._8_8_ =
             *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
        coin.out.scriptPubKey.super_CScriptBase._union._16_8_ =
             *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
        CCoinsViewCache::SetBestBlock(view,(uint256 *)&coin);
        DVar23 = (DisconnectResult)(~bVar24 & 1);
      }
      goto LAB_003f84fc;
    }
    pcVar17 = "DisconnectBlock(): block and undo data inconsistent\n";
    iVar15 = 0x8e1;
  }
  else {
    pcVar17 = "DisconnectBlock(): failure reading undo data\n";
    iVar15 = 0x8dc;
  }
  DVar23 = DISCONNECT_FAILED;
  logging_function._M_str = "DisconnectBlock";
  logging_function._M_len = 0xf;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
  ;
  source_file._M_len = 0x5e;
  LogPrintFormatInternal<>
            (logging_function,source_file,iVar15,ALL,Error,(ConstevalFormatString<0U>)pcVar17);
LAB_003f84fc:
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&blockUndo.vtxundo);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return DVar23;
  }
  __stack_chk_fail();
}

Assistant:

DisconnectResult Chainstate::DisconnectBlock(const CBlock& block, const CBlockIndex* pindex, CCoinsViewCache& view)
{
    AssertLockHeld(::cs_main);
    bool fClean = true;

    CBlockUndo blockUndo;
    if (!m_blockman.UndoReadFromDisk(blockUndo, *pindex)) {
        LogError("DisconnectBlock(): failure reading undo data\n");
        return DISCONNECT_FAILED;
    }

    if (blockUndo.vtxundo.size() + 1 != block.vtx.size()) {
        LogError("DisconnectBlock(): block and undo data inconsistent\n");
        return DISCONNECT_FAILED;
    }

    // Ignore blocks that contain transactions which are 'overwritten' by later transactions,
    // unless those are already completely spent.
    // See https://github.com/bitcoin/bitcoin/issues/22596 for additional information.
    // Note: the blocks specified here are different than the ones used in ConnectBlock because DisconnectBlock
    // unwinds the blocks in reverse. As a result, the inconsistency is not discovered until the earlier
    // blocks with the duplicate coinbase transactions are disconnected.
    bool fEnforceBIP30 = !((pindex->nHeight==91722 && pindex->GetBlockHash() == uint256{"00000000000271a2dc26e7667f8419f2e15416dc6955e5a6c6cdf3f2574dd08e"}) ||
                           (pindex->nHeight==91812 && pindex->GetBlockHash() == uint256{"00000000000af0aed4792b1acee3d966af36cf5def14935db8de83d6f9306f2f"}));

    // undo transactions in reverse order
    for (int i = block.vtx.size() - 1; i >= 0; i--) {
        const CTransaction &tx = *(block.vtx[i]);
        Txid hash = tx.GetHash();
        bool is_coinbase = tx.IsCoinBase();
        bool is_bip30_exception = (is_coinbase && !fEnforceBIP30);

        // Check that all outputs are available and match the outputs in the block itself
        // exactly.
        for (size_t o = 0; o < tx.vout.size(); o++) {
            if (!tx.vout[o].scriptPubKey.IsUnspendable()) {
                COutPoint out(hash, o);
                Coin coin;
                bool is_spent = view.SpendCoin(out, &coin);
                if (!is_spent || tx.vout[o] != coin.out || pindex->nHeight != coin.nHeight || is_coinbase != coin.fCoinBase) {
                    if (!is_bip30_exception) {
                        fClean = false; // transaction output mismatch
                    }
                }
            }
        }

        // restore inputs
        if (i > 0) { // not coinbases
            CTxUndo &txundo = blockUndo.vtxundo[i-1];
            if (txundo.vprevout.size() != tx.vin.size()) {
                LogError("DisconnectBlock(): transaction and undo data inconsistent\n");
                return DISCONNECT_FAILED;
            }
            for (unsigned int j = tx.vin.size(); j > 0;) {
                --j;
                const COutPoint& out = tx.vin[j].prevout;
                int res = ApplyTxInUndo(std::move(txundo.vprevout[j]), view, out);
                if (res == DISCONNECT_FAILED) return DISCONNECT_FAILED;
                fClean = fClean && res != DISCONNECT_UNCLEAN;
            }
            // At this point, all of txundo.vprevout should have been moved out.
        }
    }

    // move best block pointer to prevout block
    view.SetBestBlock(pindex->pprev->GetBlockHash());

    return fClean ? DISCONNECT_OK : DISCONNECT_UNCLEAN;
}